

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DosboxRawOPL.cpp
# Opt level: O0

void __thiscall DosboxRawOPL::DosboxRawOPL(DosboxRawOPL *this)

{
  DosboxRawOPL *this_local;
  
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  __normal_iterator(&this->droDataPosition);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->codeMapTable);
  this->currentOPLEmulator = invalidOpl;
  this->droMajorVersion = 0;
  this->droMinorVersion = 0;
  this->audioLength = 0;
  this->audioByteLength = 0;
  this->audioLengthPairs = 0;
  this->audioFormat = '\0';
  this->audioCompressionType = '\0';
  this->audioShortDelayLength = '\0';
  this->audioLongDelayLength = '\0';
  this->audioCodeMapLength = '\0';
  this->droData = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  return;
}

Assistant:

DosboxRawOPL::DosboxRawOPL()
{
    currentOPLEmulator = invalidOpl;
    droMajorVersion = 0;
    droMinorVersion = 0;
    audioLength = 0;
    audioByteLength = 0;
    audioLengthPairs = 0;
    audioFormat = 0;
    audioCompressionType = 0;
    audioShortDelayLength = 0;
    audioLongDelayLength = 0;
    audioCodeMapLength = 0;
    
    droData = nullptr;
}